

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_line_strip(rf_vec2 *points,int points_count,rf_color color)

{
  ulong uVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  ulong uVar5;
  
  if (1 < points_count) {
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    if (prVar4[lVar3].elements_count * 4 <= prVar4[lVar3].v_counter + points_count) {
      rf_gfx_draw();
    }
    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    if (points_count - 1U != 0) {
      uVar5 = 0;
      do {
        rf_gfx_vertex3f(points[uVar5].x,points[uVar5].y,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        uVar1 = uVar5 + 1;
        rf_gfx_vertex3f(points[uVar5 + 1].x,points[uVar5 + 1].y,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        uVar5 = uVar1;
      } while (points_count - 1U != uVar1);
    }
    rf_gfx_end();
    return;
  }
  return;
}

Assistant:

RF_API void rf_draw_line_strip(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 2)
    {
        if (rf_gfx_check_buffer_limit(points_count)) rf_gfx_draw();

        rf_gfx_begin(RF_LINES);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 0; i < points_count - 1; i++)
        {
            rf_gfx_vertex2f(points[i].x, points[i].y);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);
        }
        rf_gfx_end();
    }
}